

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int LogLuvSetupDecode(TIFF *tif)

{
  ushort uVar1;
  uint8_t *puVar2;
  int iVar3;
  code *pcVar4;
  
  puVar2 = tif->tif_data;
  tif->tif_postdecode = _TIFFNoPostDecode;
  uVar1 = (tif->tif_dir).td_photometric;
  if (uVar1 == 0x804c) {
    iVar3 = LogL16InitState(tif);
    if (iVar3 == 0) {
      return 0;
    }
    tif->tif_decoderow = LogL16Decode;
    if (*(int *)(puVar2 + 4) == 3) {
      pcVar4 = L16toGry;
    }
    else {
      if (*(int *)(puVar2 + 4) != 0) {
        return 1;
      }
      pcVar4 = L16toY;
    }
  }
  else {
    if (uVar1 != 0x804d) {
      TIFFErrorExtR(tif,"LogLuvSetupDecode",
                    "Inappropriate photometric interpretation %u for SGILog compression; %s",
                    (ulong)uVar1,"must be either LogLUV or LogL");
      return 0;
    }
    iVar3 = LogLuvInitState(tif);
    if (iVar3 == 0) {
      return 0;
    }
    if ((tif->tif_dir).td_compression == 0x8775) {
      tif->tif_decoderow = LogLuvDecode24;
      iVar3 = *(int *)(puVar2 + 4);
      if (iVar3 == 3) {
        pcVar4 = Luv24toRGB;
      }
      else if (iVar3 == 1) {
        pcVar4 = Luv24toLuv48;
      }
      else {
        if (iVar3 != 0) {
          return 1;
        }
        pcVar4 = Luv24toXYZ;
      }
    }
    else {
      tif->tif_decoderow = LogLuvDecode32;
      iVar3 = *(int *)(puVar2 + 4);
      if (iVar3 == 3) {
        pcVar4 = Luv32toRGB;
      }
      else if (iVar3 == 1) {
        pcVar4 = Luv32toLuv48;
      }
      else {
        if (iVar3 != 0) {
          return 1;
        }
        pcVar4 = Luv32toXYZ;
      }
    }
  }
  *(code **)(puVar2 + 0x20) = pcVar4;
  return 1;
}

Assistant:

static int LogLuvSetupDecode(TIFF *tif)
{
    static const char module[] = "LogLuvSetupDecode";
    LogLuvState *sp = DecoderState(tif);
    TIFFDirectory *td = &tif->tif_dir;

    tif->tif_postdecode = _TIFFNoPostDecode;
    switch (td->td_photometric)
    {
        case PHOTOMETRIC_LOGLUV:
            if (!LogLuvInitState(tif))
                break;
            if (td->td_compression == COMPRESSION_SGILOG24)
            {
                tif->tif_decoderow = LogLuvDecode24;
                switch (sp->user_datafmt)
                {
                    case SGILOGDATAFMT_FLOAT:
                        sp->tfunc = Luv24toXYZ;
                        break;
                    case SGILOGDATAFMT_16BIT:
                        sp->tfunc = Luv24toLuv48;
                        break;
                    case SGILOGDATAFMT_8BIT:
                        sp->tfunc = Luv24toRGB;
                        break;
                }
            }
            else
            {
                tif->tif_decoderow = LogLuvDecode32;
                switch (sp->user_datafmt)
                {
                    case SGILOGDATAFMT_FLOAT:
                        sp->tfunc = Luv32toXYZ;
                        break;
                    case SGILOGDATAFMT_16BIT:
                        sp->tfunc = Luv32toLuv48;
                        break;
                    case SGILOGDATAFMT_8BIT:
                        sp->tfunc = Luv32toRGB;
                        break;
                }
            }
            return (1);
        case PHOTOMETRIC_LOGL:
            if (!LogL16InitState(tif))
                break;
            tif->tif_decoderow = LogL16Decode;
            switch (sp->user_datafmt)
            {
                case SGILOGDATAFMT_FLOAT:
                    sp->tfunc = L16toY;
                    break;
                case SGILOGDATAFMT_8BIT:
                    sp->tfunc = L16toGry;
                    break;
            }
            return (1);
        default:
            TIFFErrorExtR(tif, module,
                          "Inappropriate photometric interpretation %" PRIu16
                          " for SGILog compression; %s",
                          td->td_photometric, "must be either LogLUV or LogL");
            break;
    }
    return (0);
}